

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_hash_join_executor.cpp
# Opt level: O3

bool __thiscall
duckdb::PerfectHashJoinExecutor::TemplatedFillSelectionVectorBuild<unsigned_short>
          (PerfectHashJoinExecutor *this,Vector *source,SelectionVector *sel_vec,
          SelectionVector *seq_sel_vec,idx_t count)

{
  ushort uVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  _Head_base<0UL,_bool_*,_false> _Var4;
  sel_t *psVar5;
  uint16_t uVar6;
  uint16_t uVar7;
  idx_t iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  UnifiedVectorFormat vector_data;
  UnifiedVectorFormat local_78;
  
  if (((this->perfect_join_statistics).build_min.is_null == false) &&
     ((this->perfect_join_statistics).build_max.is_null == false)) {
    uVar6 = Value::GetValueUnsafe<unsigned_short>(&(this->perfect_join_statistics).build_min);
    uVar7 = Value::GetValueUnsafe<unsigned_short>(&(this->perfect_join_statistics).build_max);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(source,count,&local_78);
    if (count == 0) {
      bVar13 = true;
    }
    else {
      psVar2 = (local_78.sel)->sel_vector;
      psVar3 = sel_vec->sel_vector;
      _Var4._M_head_impl =
           (this->bitmap_build_idx).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
           super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
           super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
           super__Head_base<0UL,_bool_*,_false>._M_head_impl;
      iVar8 = this->unique_keys;
      psVar5 = seq_sel_vec->sel_vector;
      bVar13 = false;
      lVar9 = 0;
      uVar10 = 0;
      do {
        uVar11 = uVar10;
        if (psVar2 != (sel_t *)0x0) {
          uVar11 = (ulong)psVar2[uVar10];
        }
        uVar1 = *(ushort *)(local_78.data + uVar11 * 2);
        if ((uVar6 <= uVar1) && (uVar1 <= uVar7)) {
          lVar12 = (ulong)uVar1 - (ulong)uVar6;
          psVar3[lVar9] = (sel_t)lVar12;
          if (_Var4._M_head_impl[lVar12] != false) break;
          _Var4._M_head_impl[lVar12] = true;
          iVar8 = iVar8 + 1;
          this->unique_keys = iVar8;
          psVar5[lVar9] = (sel_t)uVar10;
          lVar9 = lVar9 + 1;
        }
        uVar10 = uVar10 + 1;
        bVar13 = count <= uVar10;
      } while (uVar10 != count);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  else {
    bVar13 = false;
  }
  return bVar13;
}

Assistant:

bool PerfectHashJoinExecutor::TemplatedFillSelectionVectorBuild(Vector &source, SelectionVector &sel_vec,
                                                                SelectionVector &seq_sel_vec, idx_t count) {
	if (perfect_join_statistics.build_min.IsNull() || perfect_join_statistics.build_max.IsNull()) {
		return false;
	}
	auto min_value = perfect_join_statistics.build_min.GetValueUnsafe<T>();
	auto max_value = perfect_join_statistics.build_max.GetValueUnsafe<T>();
	UnifiedVectorFormat vector_data;
	source.ToUnifiedFormat(count, vector_data);
	auto data = reinterpret_cast<T *>(vector_data.data);
	// generate the selection vector
	for (idx_t i = 0, sel_idx = 0; i < count; ++i) {
		auto data_idx = vector_data.sel->get_index(i);
		auto input_value = data[data_idx];
		// add index to selection vector if value in the range
		if (min_value <= input_value && input_value <= max_value) {
			auto idx = (idx_t)(input_value - min_value); // subtract min value to get the idx position
			sel_vec.set_index(sel_idx, idx);
			if (bitmap_build_idx[idx]) {
				return false;
			} else {
				bitmap_build_idx[idx] = true;
				unique_keys++;
			}
			seq_sel_vec.set_index(sel_idx++, i);
		}
	}
	return true;
}